

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void plutovg_path_transform(plutovg_path_t *path,plutovg_matrix_t *matrix)

{
  plutovg_path_command_t pVar1;
  plutovg_path_element_t *ppVar2;
  int local_24;
  int i;
  plutovg_path_element_t *elements;
  plutovg_matrix_t *matrix_local;
  plutovg_path_t *path_local;
  
  ppVar2 = (path->elements).data;
  local_24 = 0;
  do {
    if ((path->elements).size <= local_24) {
      return;
    }
    pVar1 = ppVar2[local_24].header.command;
    if (pVar1 < PLUTOVG_PATH_COMMAND_CUBIC_TO) {
LAB_001614e0:
      plutovg_matrix_map_point(matrix,&ppVar2[local_24 + 1].point,&ppVar2[local_24 + 1].point);
    }
    else if (pVar1 == PLUTOVG_PATH_COMMAND_CUBIC_TO) {
      plutovg_matrix_map_point(matrix,&ppVar2[local_24 + 1].point,&ppVar2[local_24 + 1].point);
      plutovg_matrix_map_point(matrix,&ppVar2[local_24 + 2].point,&ppVar2[local_24 + 2].point);
      plutovg_matrix_map_point(matrix,&ppVar2[local_24 + 3].point,&ppVar2[local_24 + 3].point);
    }
    else if (pVar1 == PLUTOVG_PATH_COMMAND_CLOSE) goto LAB_001614e0;
    local_24 = *(int *)((long)ppVar2 + (long)local_24 * 8 + 4) + local_24;
  } while( true );
}

Assistant:

void plutovg_path_transform(plutovg_path_t* path, const plutovg_matrix_t* matrix)
{
    plutovg_path_element_t* elements = path->elements.data;
    for(int i = 0; i < path->elements.size; i += elements[i].header.length) {
        switch(elements[i].header.command) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
        case PLUTOVG_PATH_COMMAND_LINE_TO:
        case PLUTOVG_PATH_COMMAND_CLOSE:
            plutovg_matrix_map_point(matrix, &elements[i + 1].point, &elements[i + 1].point);
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            plutovg_matrix_map_point(matrix, &elements[i + 1].point, &elements[i + 1].point);
            plutovg_matrix_map_point(matrix, &elements[i + 2].point, &elements[i + 2].point);
            plutovg_matrix_map_point(matrix, &elements[i + 3].point, &elements[i + 3].point);
            break;
        }
    }
}